

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  undefined8 uVar1;
  int iVar2;
  CommandOptions Options;
  Result_t result;
  CommandOptions local_100;
  CommandOptions local_e0 [3];
  int local_78 [26];
  
  Kumu::Result_t::Result_t((Result_t *)local_78,(Result_t *)&Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&local_100,argc,argv);
  __stream = _stderr;
  if (local_100.help_flag == true) {
    main_cold_2();
    iVar2 = 0;
    goto LAB_001053f8;
  }
  iVar2 = 3;
  if (local_100.error_flag != false) goto LAB_001053f8;
  if (local_100.version_flag == true) {
    uVar1 = ASDCP::Version();
    fprintf(__stream,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2005-2009 John Hurst\n\n%s is part of asdcplib.\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"wavesplit",uVar1,"wavesplit","wavesplit");
  }
  if (local_100.info_flag == true) {
    wav_file_info(local_e0);
    Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)local_e0);
LAB_001053dd:
    Kumu::Result_t::~Result_t((Result_t *)local_e0);
  }
  else if (local_100.create_flag == true) {
    split_wav_file(local_e0);
    Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)local_e0);
    goto LAB_001053dd;
  }
  iVar2 = 0;
  if (local_78[0] != Kumu::RESULT_OK) {
    main_cold_1();
    iVar2 = local_e0[0]._0_4_;
  }
LAB_001053f8:
  Kumu::Result_t::~Result_t((Result_t *)local_78);
  return iVar2;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.help_flag )
    {
      usage();
      return 0;
    }

  if ( Options.error_flag )
    return 3;

  if ( Options.version_flag )
    banner();

  if ( Options.info_flag )
    result = wav_file_info(Options);

  else if ( Options.create_flag )
    result = split_wav_file(Options);

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}